

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_xor(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  uint uVar2;
  uint uVar3;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar2 = uVar1 >> 0x15 & 0x1f;
  uVar3 = uVar1 >> 0xb & 0x1f;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
  if (uVar2 == uVar3) {
    tcg_gen_movi_i64_ppc64(tcg_ctx,ret,0);
  }
  else {
    tcg_gen_xor_i64_ppc64(tcg_ctx,ret,cpu_gpr[uVar2],cpu_gpr[uVar3]);
  }
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)));
  return;
}

Assistant:

static void gen_xor(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /* Optimisation for "set to zero" case */
    if (rS(ctx->opcode) != rB(ctx->opcode)) {
        tcg_gen_xor_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rS(ctx->opcode)],
                       cpu_gpr[rB(ctx->opcode)]);
    } else {
        tcg_gen_movi_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], 0);
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}